

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O1

ON_wString __thiscall
ON_wString::FromCurrentCoordinatedUniversalTime
          (ON_wString *this,ON_DateFormat date_format,ON_TimeFormat time_format,
          wchar_t date_separator,wchar_t date_time_separator,wchar_t time_separator)

{
  tm *ptVar1;
  tm current_time;
  time_t gmt;
  tm local_78;
  time_t local_38;
  
  local_78.tm_isdst = 0;
  local_78._36_4_ = 0;
  local_78.tm_gmtoff = 0;
  local_78.tm_mon = 0;
  local_78.tm_year = 0;
  local_78.tm_wday = 0;
  local_78.tm_yday = 0;
  local_78.tm_sec = 0;
  local_78.tm_min = 0;
  local_78.tm_hour = 0;
  local_78.tm_mday = 0;
  local_78.tm_zone = (char *)0x0;
  local_38 = time((time_t *)0x0);
  ptVar1 = gmtime(&local_38);
  if (ptVar1 != (tm *)0x0) {
    local_78.tm_zone = ptVar1->tm_zone;
    local_78.tm_sec = ptVar1->tm_sec;
    local_78.tm_min = ptVar1->tm_min;
    local_78.tm_hour = ptVar1->tm_hour;
    local_78.tm_mday = ptVar1->tm_mday;
    local_78.tm_mon = ptVar1->tm_mon;
    local_78.tm_year = ptVar1->tm_year;
    local_78.tm_wday = ptVar1->tm_wday;
    local_78.tm_yday = ptVar1->tm_yday;
    local_78.tm_isdst = ptVar1->tm_isdst;
    local_78._36_4_ = *(undefined4 *)&ptVar1->field_0x24;
    local_78.tm_gmtoff = ptVar1->tm_gmtoff;
  }
  FromTime(this,&local_78,date_format,time_format,date_separator,date_time_separator,time_separator)
  ;
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::FromCurrentCoordinatedUniversalTime(
  ON_DateFormat date_format,
  ON_TimeFormat time_format,
  wchar_t date_separator,
  wchar_t date_time_separator,
  wchar_t time_separator
)
{
  struct tm current_time;
  memset(&current_time,0,sizeof(current_time));
  time_t gmt = time(0);
  const struct tm* t = gmtime(&gmt);
  if ( t )
    current_time = *t;
  return ON_wString::FromTime(
    current_time,
    date_format,
    time_format,
    date_separator,
    date_time_separator,
    time_separator
  );
}